

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  int key_local;
  ImGuiInputTextState *this_local;
  
  ImStb::stb_textedit_key(this,&this->Stb,key);
  this->CursorFollow = true;
  CursorAnimReset(this);
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}